

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndicesRef
          (PlanningUnitMADPDiscrete *this,Index jObsHistI)

{
  const_reference ppJVar1;
  JointObservationHistory *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  ostream *poVar3;
  E *this_01;
  uint in_ESI;
  long in_RDI;
  stringstream ss;
  JointObservationHistoryTree *joht;
  stringstream *in_stack_fffffffffffffe18;
  vector<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_>
  *in_stack_fffffffffffffe20;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  value_type local_18;
  uint local_c;
  
  if ((ulong)in_ESI < *(ulong *)(in_RDI + 0x60)) {
    ppJVar1 = std::
              vector<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_>
              ::at(in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
    local_18 = *ppJVar1;
    this_00 = JointObservationHistoryTree::GetJointObservationHistory
                        ((JointObservationHistoryTree *)0x9d7582);
    pvVar2 = JointObservationHistory::GetIndividualObservationHistoryIndices(this_00);
    return pvVar2;
  }
  local_c = in_ESI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,"PlanningUnitMADPDiscrete::JointToIndividualObservationHistory"
                          );
  poVar3 = std::operator<<(poVar3,"Indices ERROR: index (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
  poVar3 = std::operator<<(poVar3,") out of bounds!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this_01 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_01,in_stack_fffffffffffffe18);
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

const vector<Index>&
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndicesRef(Index
        jObsHistI) const
{
    if(jObsHistI < _m_nrJointObservationHistories)
    {
        JointObservationHistoryTree* joht = 
            _m_jointObservationHistoryTreeVector.at(jObsHistI);
        return(joht->GetJointObservationHistory()->
                GetIndividualObservationHistoryIndices());
    }
    else
    {
        stringstream ss;
        ss << "PlanningUnitMADPDiscrete::JointToIndividualObservationHistory"<<
           "Indices ERROR: index ("<< jObsHistI <<") out of bounds!"<<endl;
        throw E(ss); 
    }
}